

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetype.cpp
# Opt level: O0

QStringList * __thiscall QMimeType::suffixes(QMimeType *this)

{
  QLatin1StringView s;
  QChar ch;
  QChar ch_00;
  undefined1 uVar1;
  QList<QString> *this_00;
  qsizetype qVar2;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QString *pattern;
  QStringList *__range1;
  QStringList *result;
  QString suffix;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList patterns;
  undefined4 in_stack_fffffffffffffee8;
  CaseSensitivity in_stack_fffffffffffffeec;
  QList<QString> *in_stack_fffffffffffffef0;
  QString *in_stack_fffffffffffffef8;
  QMimeType *in_stack_ffffffffffffff08;
  QList<QString> *pQVar3;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined7 in_stack_ffffffffffffff28;
  QStringList *position;
  QList<QString> *this_01;
  qsizetype in_stack_ffffffffffffff78;
  QChar local_44;
  QChar local_42;
  QString *local_40;
  const_iterator local_38;
  const_iterator local_30;
  QList<QString> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QList<QString> *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  position = in_RDI;
  globPatterns(in_stack_ffffffffffffff08);
  (in_RDI->d).size = (qsizetype)this_01;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x90d7ee);
  QList<QString>::size(&local_28);
  QList<QString>::reserve(this_01,in_stack_ffffffffffffff78);
  local_30.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QString>::begin(in_stack_fffffffffffffef0);
  local_38.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = QList<QString>::end(in_stack_fffffffffffffef0);
  while( true ) {
    local_40 = local_38.i;
    uVar1 = QList<QString>::const_iterator::operator!=(&local_30,local_38);
    if (!(bool)uVar1) break;
    this_00 = (QList<QString> *)QList<QString>::const_iterator::operator*(&local_30);
    pQVar3 = this_00;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
    s.m_data._0_6_ = in_stack_ffffffffffffff18;
    s.m_size = (qsizetype)pQVar3;
    s.m_data._6_1_ = in_stack_ffffffffffffff1e;
    s.m_data._7_1_ = in_stack_ffffffffffffff1f;
    in_stack_ffffffffffffff1f =
         QString::startsWith((QString *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),s,
                             CaseInsensitive);
    if (((bool)in_stack_ffffffffffffff1f) && (qVar2 = QString::size((QString *)this_00), 2 < qVar2))
    {
      QChar::QChar<char16_t,_true>(&local_42,L'*');
      ch.ucs._1_1_ = in_stack_ffffffffffffff1f;
      ch.ucs._0_1_ = in_stack_ffffffffffffff1e;
      qVar2 = QString::indexOf(in_stack_fffffffffffffef8,ch,(qsizetype)in_stack_fffffffffffffef0,
                               in_stack_fffffffffffffeec);
      if (qVar2 < 0) {
        QChar::QChar<char16_t,_true>(&local_44,L'?');
        ch_00.ucs._1_1_ = in_stack_ffffffffffffff1f;
        ch_00.ucs._0_1_ = in_stack_ffffffffffffff1e;
        in_stack_fffffffffffffef8 =
             (QString *)
             QString::indexOf(in_stack_fffffffffffffef8,ch_00,(qsizetype)this_00,
                              in_stack_fffffffffffffeec);
        in_stack_fffffffffffffef0 = this_00;
        if ((long)in_stack_fffffffffffffef8 < 0) {
          QString::mid((QString *)this_01,(qsizetype)position,
                       CONCAT17(uVar1,in_stack_ffffffffffffff28));
          QList<QString>::append
                    (this_00,(parameter_type)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          QString::~QString((QString *)0x90da39);
          in_stack_fffffffffffffef0 = this_00;
        }
      }
    }
    QList<QString>::const_iterator::operator++(&local_30);
  }
  QList<QString>::~QList((QList<QString> *)0x90dabe);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return position;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeType::suffixes() const
{
    const QStringList patterns = globPatterns();

    QStringList result;
    result.reserve(patterns.size());
    for (const QString &pattern : patterns) {
        // Not a simple suffix if it looks like: README or *. or *.* or *.JP*G or *.JP?
        if (pattern.startsWith("*."_L1) &&
            pattern.size() > 2 &&
            pattern.indexOf(u'*', 2) < 0 && pattern.indexOf(u'?', 2) < 0) {
            const QString suffix = pattern.mid(2);
            result.append(suffix);
        }
    }

    return result;
}